

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O2

void * __thiscall duckdb_re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  int __c;
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  ulong uVar14;
  
  if (this->prefix_foldcase_ != true) {
    if (this->prefix_size_ == 1) {
      pvVar3 = memchr(data,(this->field_11).prefix_front_back.prefix_front_,size);
      return pvVar3;
    }
    uVar2 = this->prefix_size_;
    if (uVar2 <= size) {
      __c = (this->field_11).prefix_front_back.prefix_front_;
      iVar1 = (this->field_11).prefix_front_back.prefix_back_;
      pvVar3 = data;
      while (pvVar3 = memchr(pvVar3,__c,(long)data + (((size + 1) - uVar2) - (long)pvVar3)),
            pvVar3 != (void *)0x0) {
        if (iVar1 == *(char *)((long)pvVar3 + (uVar2 - 1))) {
          return pvVar3;
        }
        pvVar3 = (void *)((long)pvVar3 + 1);
      }
    }
    return (void *)0x0;
  }
  uVar2 = this->prefix_size_;
  if (size < uVar2) {
    return (void *)0x0;
  }
  if (size < 8) {
    puVar13 = (this->field_11).prefix_dfa_;
    uVar8 = 0;
  }
  else {
    pbVar4 = (byte *)((size & 0xfffffffffffffff8) + (long)data);
    puVar13 = (this->field_11).prefix_dfa_;
    uVar8 = 0;
    do {
      uVar14 = puVar13[*data] >> ((byte)uVar8 & 0x3f);
      uVar5 = puVar13[*(byte *)((long)data + 1)] >> ((byte)uVar14 & 0x3f);
      uVar12 = puVar13[*(byte *)((long)data + 2)] >> ((byte)uVar5 & 0x3f);
      uVar11 = puVar13[*(byte *)((long)data + 3)] >> ((byte)uVar12 & 0x3f);
      uVar10 = puVar13[*(byte *)((long)data + 4)] >> ((byte)uVar11 & 0x3f);
      uVar9 = puVar13[*(byte *)((long)data + 5)] >> ((byte)uVar10 & 0x3f);
      uVar6 = puVar13[*(byte *)((long)data + 6)] >> ((byte)uVar9 & 0x3f);
      uVar8 = puVar13[*(byte *)((long)data + 7)] >> ((byte)uVar6 & 0x3f);
      if (((uint)uVar8 & 0x3f) == 0x36) {
        if ((0x36U - (int)uVar14 & 0x3f) == 0) {
          return (byte *)((long)data + (1 - uVar2));
        }
        if ((0x36U - (int)uVar5 & 0x3f) == 0) {
          return (byte *)((long)data + (2 - uVar2));
        }
        if ((0x36U - (int)uVar12 & 0x3f) == 0) {
          return (byte *)((long)data + (3 - uVar2));
        }
        if ((0x36U - (int)uVar11 & 0x3f) != 0) {
          if ((0x36U - (int)uVar10 & 0x3f) == 0) {
            return (byte *)((long)data + (5 - uVar2));
          }
          if ((0x36U - (int)uVar9 & 0x3f) != 0) {
            if ((0x36U - (int)uVar6 & 0x3f) != 0) {
              return (byte *)((long)data + (8 - uVar2));
            }
            return (byte *)((long)data + (7 - uVar2));
          }
          return (byte *)((long)data + (6 - uVar2));
        }
        return (byte *)((long)data + (4 - uVar2));
      }
      data = (void *)((long)data + 8);
    } while ((byte *)data != pbVar4);
    size = (size_t)((uint)size & 7);
    data = pbVar4;
  }
  sVar7 = 0;
  do {
    if (size == sVar7) {
      return (void *)0x0;
    }
    uVar8 = puVar13[*(byte *)((long)data + sVar7)] >> ((byte)uVar8 & 0x3f);
    sVar7 = sVar7 + 1;
  } while (((uint)uVar8 & 0x3f) != 0x36);
  return (byte *)((long)data + (sVar7 - uVar2));
}

Assistant:

const void* PrefixAccel(const void* data, size_t size) {
    DCHECK(can_prefix_accel());
    if (prefix_foldcase_) {
      return PrefixAccel_ShiftDFA(data, size);
    } else if (prefix_size_ != 1) {
      return PrefixAccel_FrontAndBack(data, size);
    } else {
      return memchr(data, prefix_front_back.prefix_front_, size);
    }
  }